

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImVec4>::push_back(ImVector<ImVec4> *this,ImVec4 *v)

{
  undefined8 uVar1;
  ImVec4 *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImVec4> *in_RDI;
  ImVector<ImVec4> *unaff_retaddr;
  ImVector<ImVec4> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data + in_RDI->Size;
  uVar1 = *in_RSI;
  pIVar2->x = (float)(int)uVar1;
  pIVar2->y = (float)(int)((ulong)uVar1 >> 0x20);
  uVar1 = in_RSI[1];
  pIVar2->z = (float)(int)uVar1;
  pIVar2->w = (float)(int)((ulong)uVar1 >> 0x20);
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }